

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VLDM_VSTM_sp(DisasContext_conflict1 *s,arg_VLDM_VSTM_sp *a)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  TCGv_i32 ret;
  TCGTemp *a1;
  TCGv_i32 val;
  _Bool _Var5;
  int iVar6;
  uintptr_t o;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  
  if (((((s->isar->mvfr0 & 0xf0) == 0) || (iVar1 = a->imm, iVar1 == 0)) || (0x20 < a->vd + iVar1))
     || ((tcg_ctx = s->uc->tcg_ctx, a->rn == 0xf && (a->w != 0)))) {
    _Var5 = false;
  }
  else {
    _Var2 = full_vfp_access_check(s,false);
    _Var5 = true;
    if (_Var2) {
      ret = add_reg_for_lit(s,a->rn,0);
      if (a->p != 0) {
        tcg_gen_addi_i32_aarch64(tcg_ctx,ret,ret,a->imm * -4);
      }
      if (((s->v8m_stackcheck == true) && (a->rn == 0xd)) && (a->w != 0)) {
        local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        local_40 = ret + (long)&tcg_ctx->pool_cur;
        tcg_gen_callN_aarch64(tcg_ctx,helper_v8m_stackcheck_aarch64,(TCGTemp *)0x0,2,&local_48);
      }
      iVar6 = 0;
      a1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
      val = (TCGv_i32)((long)a1 - (long)tcg_ctx);
      if (0 < iVar1) {
        do {
          if (a->l == 0) {
            uVar3 = a->vd + iVar6;
            uVar4 = uVar3 * 4;
            tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)a1,
                                (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                                (ulong)(uVar4 & 4) + ((ulong)(uVar4 & 8) | (ulong)(uVar3 >> 2) << 8)
                                + 0xc10);
            gen_aa32_st_i32(s,val,ret,s->mmu_idx & 0xf,s->be_data | MO_32);
          }
          else {
            gen_aa32_ld_i32(s,val,ret,s->mmu_idx & 0xf,s->be_data | MO_32);
            uVar3 = a->vd + iVar6;
            uVar4 = uVar3 * 4;
            tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i32,(TCGArg)a1,
                                (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                                (ulong)(uVar4 & 4) + ((ulong)(uVar4 & 8) | (ulong)(uVar3 >> 2) << 8)
                                + 0xc10);
          }
          tcg_gen_addi_i32_aarch64(tcg_ctx,ret,ret,4);
          iVar6 = iVar6 + 1;
        } while (iVar1 != iVar6);
      }
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
      if (a->w == 0) {
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      }
      else {
        if (a->p != 0) {
          tcg_gen_addi_i32_aarch64(tcg_ctx,ret,ret,iVar1 * -4);
        }
        store_reg(s,a->rn,ret);
      }
      _Var5 = true;
    }
  }
  return _Var5;
}

Assistant:

static bool trans_VLDM_VSTM_sp(DisasContext *s, arg_VLDM_VSTM_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t offset;
    TCGv_i32 addr, tmp;
    int i, n;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    n = a->imm;

    if (n == 0 || (a->vd + n) > 32) {
        /*
         * UNPREDICTABLE cases for bad immediates: we choose to
         * UNDEF to avoid generating huge numbers of TCG ops
         */
        return false;
    }
    if (a->rn == 15 && a->w) {
        /* writeback to PC is UNPREDICTABLE, we choose to UNDEF */
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    /* For thumb, use of PC is UNPREDICTABLE.  */
    addr = add_reg_for_lit(s, a->rn, 0);
    if (a->p) {
        /* pre-decrement */
        tcg_gen_addi_i32(tcg_ctx, addr, addr, -(a->imm << 2));
    }

    if (s->v8m_stackcheck && a->rn == 13 && a->w) {
        /*
         * Here 'addr' is the lowest address we will store to,
         * and is either the old SP (if post-increment) or
         * the new SP (if pre-decrement). For post-increment
         * where the old value is below the limit and the new
         * value is above, it is UNKNOWN whether the limit check
         * triggers; we choose to trigger.
         */
        gen_helper_v8m_stackcheck(tcg_ctx, tcg_ctx->cpu_env, addr);
    }

    offset = 4;
    tmp = tcg_temp_new_i32(tcg_ctx);
    for (i = 0; i < n; i++) {
        if (a->l) {
            /* load */
            gen_aa32_ld32u(s, tmp, addr, get_mem_index(s));
            neon_store_reg32(tcg_ctx, tmp, a->vd + i);
        } else {
            /* store */
            neon_load_reg32(tcg_ctx, tmp, a->vd + i);
            gen_aa32_st32(s, tmp, addr, get_mem_index(s));
        }
        tcg_gen_addi_i32(tcg_ctx, addr, addr, offset);
    }
    tcg_temp_free_i32(tcg_ctx, tmp);
    if (a->w) {
        /* writeback */
        if (a->p) {
#ifdef _MSC_VER
            offset = (0 - offset) * n;
#else
            offset = -offset * n;
#endif
            tcg_gen_addi_i32(tcg_ctx, addr, addr, offset);
        }
        store_reg(s, a->rn, addr);
    } else {
        tcg_temp_free_i32(tcg_ctx, addr);
    }

    return true;
}